

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O1

void __thiscall
List<Callback::Listener::Signal>::List
          (List<Callback::Listener::Signal> *this,List<Callback::Listener::Signal> *other)

{
  Item *value;
  
  (this->_end).item = &this->endItem;
  (this->_begin).item = &this->endItem;
  this->_size = 0;
  (this->endItem).value.signal.ptr = 0;
  *(undefined8 *)&(this->endItem).value.signal.field_0x8 = 0;
  (this->endItem).value.slot.ptr = 0;
  *(undefined8 *)&(this->endItem).value.slot.field_0x8 = 0;
  (this->endItem).prev = (Item *)0x0;
  (this->endItem).next = (Item *)0x0;
  this->freeItem = (Item *)0x0;
  this->blocks = (ItemBlock *)0x0;
  for (value = (other->_begin).item; value != &other->endItem; value = value->next) {
    insert(this,&this->_end,&value->value);
  }
  return;
}

Assistant:

List(const List& other) : _end(&endItem), _begin(&endItem), _size(0), freeItem(0), blocks(0)
  {
    endItem.prev = 0;
    endItem.next = 0;
    for(const Item* i = other._begin.item, * end = &other.endItem; i != end; i = i->next)
      append(i->value);
  }